

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void __thiscall Bitmap::drawLine(Bitmap *this,uint32_t y,uint32_t height)

{
  int32_t pixel;
  uint32_t i;
  uint x;
  
  if (height != 0) {
    for (x = 0; x < this->width; x = x + 1) {
      pixel = getPixelIndex(this,x,y);
      setPixelValue(this,pixel,true);
    }
    duplicateLineDown(this,y,height - 1);
    return;
  }
  return;
}

Assistant:

void Bitmap::drawLine(uint32_t y, uint32_t height)
{
   if (height > 0)
   {
      //draw horizontal line
      for (uint32_t i = 0; i < width; ++i)
      {
         uint32_t pixel = getPixelIndex(i, y);
         setPixelValue(pixel, 1);
      }
      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}